

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::GetGeneratorDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  pointer ppcVar5;
  _Rb_tree_header *p_Var6;
  cmDocumentationEntry e;
  value_type local_78;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *local_38;
  
  ppcVar5 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = v;
  if (ppcVar5 !=
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_78.Name.field_2;
    paVar2 = &local_78.Brief.field_2;
    do {
      local_78.Name._M_string_length = 0;
      local_78.Name.field_2._M_local_buf[0] = '\0';
      local_78.Brief._M_string_length = 0;
      local_78.Brief.field_2._M_local_buf[0] = '\0';
      local_78.Name._M_dataplus._M_p = (pointer)paVar1;
      local_78.Brief._M_dataplus._M_p = (pointer)paVar2;
      (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar5,&local_78);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                (local_38,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.Brief._M_dataplus._M_p != paVar2) {
        operator_delete(local_78.Brief._M_dataplus._M_p,
                        CONCAT71(local_78.Brief.field_2._M_allocated_capacity._1_7_,
                                 local_78.Brief.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.Name._M_dataplus._M_p,
                        CONCAT71(local_78.Name.field_2._M_allocated_capacity._1_7_,
                                 local_78.Name.field_2._M_local_buf[0]) + 1);
      }
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 !=
             (this->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var4 = (this->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    paVar1 = &local_78.Name.field_2;
    do {
      local_78.Name._M_string_length = 0;
      local_78.Name.field_2._M_local_buf[0] = '\0';
      local_78.Brief._M_dataplus._M_p = (pointer)&local_78.Brief.field_2;
      local_78.Brief._M_string_length = 0;
      local_78.Brief.field_2._M_local_buf[0] = '\0';
      local_78.Name._M_dataplus._M_p = (pointer)paVar1;
      plVar3 = (long *)(**(code **)(p_Var4 + 2))();
      (**(code **)(*plVar3 + 0x18))(plVar3,&local_78,p_Var4 + 1);
      std::__cxx11::string::_M_assign((string *)&local_78);
      (**(code **)(*plVar3 + 8))(plVar3);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                (local_38,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.Brief._M_dataplus._M_p != &local_78.Brief.field_2) {
        operator_delete(local_78.Brief._M_dataplus._M_p,
                        CONCAT71(local_78.Brief.field_2._M_allocated_capacity._1_7_,
                                 local_78.Brief.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.Name._M_dataplus._M_p,
                        CONCAT71(local_78.Name.field_2._M_allocated_capacity._1_7_,
                                 local_78.Name.field_2._M_local_buf[0]) + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  return;
}

Assistant:

void cmake::GetGeneratorDocumentation(std::vector<cmDocumentationEntry>& v)
{
  for(RegisteredGeneratorsVector::const_iterator i =
      this->Generators.begin(); i != this->Generators.end(); ++i)
    {
    cmDocumentationEntry e;
    (*i)->GetDocumentation(e);
    v.push_back(e);
    }
  for(RegisteredExtraGeneratorsMap::const_iterator i =
      this->ExtraGenerators.begin(); i != this->ExtraGenerators.end(); ++i)
    {
    cmDocumentationEntry e;
    cmExternalMakefileProjectGenerator* generator = (i->second)();
    generator->GetDocumentation(e, i->first);
    e.Name = i->first;
    delete generator;
    v.push_back(e);
    }
}